

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall CLI::Option::get_name_abi_cxx11_(Option *this,bool positional,bool all_options)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  reference pbVar4;
  byte in_CL;
  byte in_DL;
  OptionBase<CLI::Option> *in_RSI;
  string *in_RDI;
  string *lname_1;
  const_iterator __end3_3;
  const_iterator __begin3_3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_3;
  string *sname_1;
  const_iterator __end3_2;
  const_iterator __begin3_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_2;
  string *lname;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_1;
  string *sname;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  name_list;
  value_type *in_stack_fffffffffffffc98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffca0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  value_type *in_stack_fffffffffffffca8;
  reference in_stack_fffffffffffffcb0;
  char __c;
  size_type in_stack_fffffffffffffcb8;
  undefined7 in_stack_fffffffffffffcc0;
  undefined1 in_stack_fffffffffffffcc7;
  allocator<char> *in_stack_fffffffffffffcd0;
  uint in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffcdc;
  string *__lhs;
  Option *in_stack_fffffffffffffcf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d9;
  allocator<char> local_2b1 [65];
  reference local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_268;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_260;
  undefined1 *local_258;
  reference local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_228;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_220;
  OptionBase<CLI::Option> *local_218;
  allocator<char> local_209 [33];
  string *in_stack_fffffffffffffe18;
  string *in_stack_fffffffffffffe20;
  Option *in_stack_fffffffffffffe28;
  string *in_stack_fffffffffffffe70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe78;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_138;
  undefined1 *local_130;
  allocator<char> local_121 [193];
  reference local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  OptionBase<CLI::Option> *local_48;
  byte local_12;
  byte local_11;
  
  local_11 = in_DL & 1;
  local_12 = in_CL & 1;
  __lhs = in_RDI;
  OptionBase<CLI::Option>::get_group_abi_cxx11_(in_RSI);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x19dfb5);
  if (bVar1) {
    ::std::__cxx11::string::string(in_stack_fffffffffffffcb0);
  }
  else if ((local_12 & 1) == 0) {
    if ((local_11 & 1) == 0) {
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffcb0);
      if (bVar1) {
        bVar1 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffcb0);
        __c = (char)((ulong)in_stack_fffffffffffffcb0 >> 0x38);
        if (bVar1) {
          ::std::__cxx11::string::string
                    (in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
        }
        else {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0),
                     in_stack_fffffffffffffcb8,__c,(allocator<char> *)in_stack_fffffffffffffca8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(in_RSI + 1),0);
          ::std::operator+(in_stack_fffffffffffffca8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffca0);
          ::std::__cxx11::string::~string(in_stack_fffffffffffffca0);
          ::std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffcff);
        }
      }
      else {
        __rhs = &local_2d9;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0),
                   in_stack_fffffffffffffcb8,(char)((ulong)in_stack_fffffffffffffcb0 >> 0x38),
                   (allocator<char> *)in_stack_fffffffffffffca8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&in_RSI[1].group_.field_2 + 8),0);
        ::std::operator+(in_stack_fffffffffffffca8,__rhs);
        ::std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
      }
    }
    else {
      ::std::__cxx11::string::string
                (in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    }
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x19dfe5);
    if ((((local_11 & 1) != 0) &&
        (bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x19e000
                      ), !bVar1)) ||
       ((bVar1 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffffcb0), bVar1 &&
        (bVar1 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffffcb0), bVar1)))) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    }
    iVar3 = get_items_expected((Option *)0x19e06e);
    if ((iVar3 != 0) ||
       (bVar1 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffcb0), bVar1)) {
      local_218 = in_RSI + 1;
      local_220._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffc98);
      local_228 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffc98);
      while (bVar1 = __gnu_cxx::
                     operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffffca0,
                                (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffffc98), ((bVar1 ^ 0xffU) & 1) != 0) {
        local_230 = __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&local_220);
        ::std::operator+((char *)__lhs,in_RDI);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
        ::std::__cxx11::string::~string(in_stack_fffffffffffffca0);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_220);
      }
      local_258 = (undefined1 *)((long)&in_RSI[1].group_.field_2 + 8);
      local_260._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffc98);
      local_268 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffc98);
      while (bVar1 = __gnu_cxx::
                     operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffffca0,
                                (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffffc98), ((bVar1 ^ 0xffU) & 1) != 0) {
        local_270 = __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&local_260);
        ::std::operator+((char *)__lhs,in_RDI);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
        ::std::__cxx11::string::~string(in_stack_fffffffffffffca0);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_260);
      }
    }
    else {
      local_48 = in_RSI + 1;
      local_50._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffc98);
      local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffffc98);
      while (bVar1 = __gnu_cxx::
                     operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffffca0,
                                (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffffc98), ((bVar1 ^ 0xffU) & 1) != 0) {
        local_60 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_50);
        ::std::operator+((char *)__lhs,in_RDI);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
        ::std::__cxx11::string::~string(in_stack_fffffffffffffca0);
        ::std::__cxx11::string::string
                  (in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(iVar3,in_stack_fffffffffffffcd8));
        bVar1 = check_fname(in_stack_fffffffffffffcf8,&in_RSI->group_);
        in_stack_fffffffffffffcd8 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffcd8);
        ::std::__cxx11::string::~string(in_stack_fffffffffffffca0);
        if ((in_stack_fffffffffffffcd8 & 0x1000000) != 0) {
          in_stack_fffffffffffffcd0 = local_121;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string<std::allocator<char>>
                    (in_RDI,(char *)CONCAT44(iVar3,in_stack_fffffffffffffcd8),
                     in_stack_fffffffffffffcd0);
          get_flag_value(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                         in_stack_fffffffffffffe18);
          ::std::operator+((char *)in_stack_fffffffffffffca8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffca0);
          ::std::operator+(in_stack_fffffffffffffca8,(char *)in_stack_fffffffffffffca0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffca0);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
          ::std::__cxx11::string::~string(in_stack_fffffffffffffca0);
          ::std::__cxx11::string::~string(in_stack_fffffffffffffca0);
          ::std::__cxx11::string::~string(in_stack_fffffffffffffca0);
          ::std::__cxx11::string::~string(in_stack_fffffffffffffca0);
          ::std::allocator<char>::~allocator((allocator<char> *)local_121);
        }
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_50);
      }
      local_130 = (undefined1 *)((long)&in_RSI[1].group_.field_2 + 8);
      local_138._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffc98);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffc98);
      while (bVar1 = __gnu_cxx::
                     operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffffca0,
                                (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffffc98), ((bVar1 ^ 0xffU) & 1) != 0) {
        pbVar4 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_138);
        ::std::operator+((char *)__lhs,in_RDI);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
        ::std::__cxx11::string::~string(in_stack_fffffffffffffca0);
        ::std::__cxx11::string::string
                  (in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(iVar3,in_stack_fffffffffffffcd8));
        bVar2 = check_fname(in_stack_fffffffffffffcf8,&in_RSI->group_);
        ::std::__cxx11::string::~string(in_stack_fffffffffffffca0);
        if ((bVar2 & 1) != 0) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string<std::allocator<char>>
                    (in_RDI,(char *)CONCAT44(iVar3,in_stack_fffffffffffffcd8),
                     in_stack_fffffffffffffcd0);
          get_flag_value(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                         in_stack_fffffffffffffe18);
          ::std::operator+((char *)in_stack_fffffffffffffca8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffca0);
          ::std::operator+(in_stack_fffffffffffffca8,(char *)in_stack_fffffffffffffca0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffca0);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
          ::std::__cxx11::string::~string(in_stack_fffffffffffffca0);
          ::std::__cxx11::string::~string(in_stack_fffffffffffffca0);
          ::std::__cxx11::string::~string(in_stack_fffffffffffffca0);
          ::std::__cxx11::string::~string(in_stack_fffffffffffffca0);
          ::std::allocator<char>::~allocator(local_209);
          in_stack_fffffffffffffcb0 = pbVar4;
        }
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_138);
      }
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              (in_RDI,(char *)CONCAT44(iVar3,in_stack_fffffffffffffcd8),in_stack_fffffffffffffcd0);
    CLI::detail::join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffca0);
    ::std::allocator<char>::~allocator(local_2b1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffcb0);
  }
  return __lhs;
}

Assistant:

CLI11_NODISCARD CLI11_INLINE std::string Option::get_name(bool positional, bool all_options) const {
    if(get_group().empty())
        return {};  // Hidden

    if(all_options) {

        std::vector<std::string> name_list;

        /// The all list will never include a positional unless asked or that's the only name.
        if((positional && (!pname_.empty())) || (snames_.empty() && lnames_.empty())) {
            name_list.push_back(pname_);
        }
        if((get_items_expected() == 0) && (!fnames_.empty())) {
            for(const std::string &sname : snames_) {
                name_list.push_back("-" + sname);
                if(check_fname(sname)) {
                    name_list.back() += "{" + get_flag_value(sname, "") + "}";
                }
            }

            for(const std::string &lname : lnames_) {
                name_list.push_back("--" + lname);
                if(check_fname(lname)) {
                    name_list.back() += "{" + get_flag_value(lname, "") + "}";
                }
            }
        } else {
            for(const std::string &sname : snames_)
                name_list.push_back("-" + sname);

            for(const std::string &lname : lnames_)
                name_list.push_back("--" + lname);
        }

        return detail::join(name_list);
    }

    // This returns the positional name no matter what
    if(positional)
        return pname_;

    // Prefer long name
    if(!lnames_.empty())
        return std::string(2, '-') + lnames_[0];

    // Or short name if no long name
    if(!snames_.empty())
        return std::string(1, '-') + snames_[0];

    // If positional is the only name, it's okay to use that
    return pname_;
}